

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_date(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  char *zIn;
  tm *ptVar2;
  time_t t;
  int nLen;
  anon_union_8_3_18420de5_for_x local_70;
  int local_64;
  Sytm local_60;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pRet;
    jx9MemObjRelease(pjVar1);
    (pjVar1->x).rVal = 0.0;
    pjVar1->iFlags = pjVar1->iFlags & 0xfffffe90U | 8;
    return 0;
  }
  zIn = jx9_value_to_string(*apArg,&local_64);
  if (local_64 < 1) {
    jx9_value_string(pCtx->pRet,"",0);
  }
  if (nArg == 1) {
    time(&local_70.iVal);
  }
  else {
    pjVar1 = apArg[1];
    if ((pjVar1->iFlags & 2) != 0) {
      jx9MemObjToInteger(pjVar1);
      local_70 = pjVar1->x;
      ptVar2 = localtime(&local_70.iVal);
      if (ptVar2 != (tm *)0x0) goto LAB_001346f5;
    }
    time(&local_70.iVal);
  }
LAB_001346f5:
  ptVar2 = localtime(&local_70.iVal);
  local_60.tm_hour = ptVar2->tm_hour;
  local_60.tm_min = ptVar2->tm_min;
  local_60.tm_sec = ptVar2->tm_sec;
  local_60.tm_mon = ptVar2->tm_mon;
  local_60.tm_mday = ptVar2->tm_mday;
  local_60.tm_year = ptVar2->tm_year + 0x76c;
  local_60.tm_yday = ptVar2->tm_yday;
  local_60.tm_wday = ptVar2->tm_wday;
  local_60.tm_isdst = ptVar2->tm_isdst;
  local_60.tm_zone = (char *)0x0;
  local_60.tm_gmtoff = 0;
  DateFormat(pCtx,zIn,local_64,&local_60);
  return 0;
}

Assistant:

static int jx9Builtin_date(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zFormat;
	int nLen;
	Sytm sTm;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zFormat = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Don't bother processing return the empty string */
		jx9_result_string(pCtx, "", 0);
	}
	if( nArg < 2 ){
#ifdef __WINNT__
		SYSTEMTIME sOS;
		GetSystemTime(&sOS);
		SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
		struct tm *pTm;
		time_t t;
		time(&t);
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	}else{
		/* Use the given timestamp */
		time_t t;
		struct tm *pTm;
		if( jx9_value_is_int(apArg[1]) ){
			t = (time_t)jx9_value_to_int64(apArg[1]);
			pTm = localtime(&t);
			if( pTm == 0 ){
				time(&t);
			}
		}else{
			time(&t);
		}
		pTm = localtime(&t);
		STRUCT_TM_TO_SYTM(pTm, &sTm);
	}
	/* Format the given string */
	DateFormat(pCtx, zFormat, nLen, &sTm);
	return JX9_OK;
}